

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O2

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  if (2 < current->_M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&bStack_48,current,0,2);
    bVar1 = ::std::operator==(&bStack_48,"--");
    if ((bVar1) &&
       ((uVar2 = (ulong)(byte)(current->_M_dataplus)._M_p[2], 0x2d < uVar2 ||
        ((0x200300000400U >> (uVar2 & 0x3f) & 1) == 0)))) {
      ::std::__cxx11::string::~string((string *)&bStack_48);
      sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)current,'=',
                   0);
      if (sVar3 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,2,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (value,"");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,2,sVar3 - 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,sVar3 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
      }
      bVar1 = true;
    }
    else {
      ::std::__cxx11::string::~string((string *)&bStack_48);
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

inline bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.substr(0, 2) == "--" && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}